

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

_Bool ConnectionExists(SessionHandle *data,connectdata *needle,connectdata **usethis,
                      _Bool *force_reuse)

{
  uint uVar1;
  connectdata *conn;
  curl_llist_element *pcVar2;
  char *__s2;
  bool bVar3;
  _Bool _Var4;
  _Bool _Var5;
  int iVar6;
  connectbundle *pcVar7;
  size_t sVar8;
  SessionHandle *pSVar9;
  curl_llist_element *pcVar10;
  SessionHandle *handle;
  ulong uVar11;
  bool bVar12;
  connectdata *local_60;
  ulong local_58;
  
  _Var4 = IsPipeliningPossible(data,needle);
  if (((data->state).authhost.want & 0x28) == 0) {
    bVar12 = false;
  }
  else {
    bVar12 = (needle->handler->protocol & 3) != 0;
  }
  *force_reuse = false;
  if (_Var4) {
    _Var5 = Curl_pipeline_site_blacklisted(data,needle);
    _Var4 = _Var4 && !_Var5;
  }
  pcVar7 = Curl_conncache_find_bundle((data->state).conn_cache,(needle->host).name);
  if (pcVar7 == (connectbundle *)0x0) {
    local_60 = (connectdata *)0x0;
  }
  else {
    sVar8 = Curl_multi_max_pipeline_length(data->multi);
    Curl_infof(data,"Found bundle for host %s: %p\n",(needle->host).name,pcVar7);
    if ((_Var4 != false) && (pcVar7->server_supports_pipelining == false)) {
      _Var4 = false;
      Curl_infof(data,"Server doesn\'t support pipelining\n");
    }
    pcVar10 = pcVar7->conn_list->head;
    local_60 = (connectdata *)0x0;
    local_58 = sVar8;
    do {
      if (pcVar10 == (curl_llist_element *)0x0) break;
      conn = (connectdata *)pcVar10->ptr;
      pcVar10 = pcVar10->next;
      _Var5 = disconnect_if_dead(conn,data);
      if (_Var5) {
LAB_0047c981:
        bVar3 = false;
        conn = local_60;
      }
      else {
        uVar11 = conn->recv_pipe->size + conn->send_pipe->size;
        if (_Var4 == false) {
          if (uVar11 == 0) {
            if ((conn->sock[0] != -1) && ((conn->bits).close != true)) goto LAB_0047c657;
            bVar3 = false;
            Curl_infof(data,"Connection #%ld isn\'t open enough, can\'t reuse\n",conn->connection_id
                      );
            conn = local_60;
            goto LAB_0047c984;
          }
          goto LAB_0047c981;
        }
        pcVar2 = conn->send_pipe->head;
        if (pcVar2 == (curl_llist_element *)0x0) {
          handle = (SessionHandle *)0x0;
        }
        else {
          handle = (SessionHandle *)pcVar2->ptr;
        }
        pcVar2 = conn->recv_pipe->head;
        if (pcVar2 == (curl_llist_element *)0x0) {
          pSVar9 = (SessionHandle *)0x0;
        }
        else {
          pSVar9 = (SessionHandle *)pcVar2->ptr;
        }
        if (((handle != (SessionHandle *)0x0) || (handle = pSVar9, pSVar9 != (SessionHandle *)0x0))
           && (_Var5 = IsPipeliningPossible(handle,conn), !_Var5)) goto LAB_0047c981;
LAB_0047c657:
        uVar1 = needle->handler->flags;
        if ((((conn->handler->flags ^ uVar1) & 1) == 0) ||
           ((needle->handler->protocol & conn->handler->protocol) != 0)) {
          if ((uVar1 & 1) != 0) {
            if ((data->set).ssl.verifypeer != conn->verifypeer) {
              bVar3 = false;
              conn = local_60;
              goto LAB_0047c984;
            }
            if ((data->set).ssl.verifyhost != conn->verifyhost) goto LAB_0047c745;
          }
          if ((((needle->bits).proxy != (conn->bits).proxy) ||
              ((_Var4 == false && (conn->inuse != false)))) ||
             ((((__s2 = needle->localdev, __s2 != (char *)0x0 || (needle->localport != 0)) &&
               ((((conn->localport != needle->localport ||
                  (conn->localportrange != needle->localportrange)) || (__s2 == (char *)0x0)) ||
                ((conn->localdev == (char *)0x0 || (iVar6 = strcmp(conn->localdev,__s2), iVar6 != 0)
                 ))))) ||
              ((-1 < (char)uVar1 || bVar12 &&
               ((iVar6 = curl_strequal(needle->user,conn->user), iVar6 == 0 ||
                (iVar6 = curl_strequal(needle->passwd,conn->passwd), iVar6 == 0))))))))
          goto LAB_0047c745;
          if ((((needle->bits).httpproxy != true) || ((needle->handler->flags & 1) != 0)) ||
             (((((conn->bits).httpproxy == true && ((needle->bits).tunnel_proxy == true)) &&
               ((conn->bits).tunnel_proxy == true)) &&
              ((iVar6 = Curl_raw_equal((needle->proxy).name,(conn->proxy).name), iVar6 != 0 &&
               (needle->port == conn->port)))))) {
            iVar6 = Curl_raw_equal(needle->handler->scheme,conn->handler->scheme);
            if ((((iVar6 != 0) || ((needle->handler->protocol & conn->handler->protocol) != 0)) &&
                ((iVar6 = Curl_raw_equal((needle->host).name,(conn->host).name), iVar6 != 0 &&
                 (needle->remote_port == conn->remote_port)))) &&
               (((needle->handler->flags & 1) == 0 ||
                ((_Var5 = Curl_ssl_config_matches(&needle->ssl_config,&conn->ssl_config), _Var5 &&
                 (conn->ssl[0].state == ssl_connection_complete)))))) goto LAB_0047c88d;
            goto LAB_0047c981;
          }
          if ((((conn->bits).proxy != true) ||
              (((needle->proxytype != conn->proxytype ||
                ((needle->bits).tunnel_proxy != (conn->bits).tunnel_proxy)) ||
               (iVar6 = Curl_raw_equal((needle->proxy).name,(conn->proxy).name), iVar6 == 0)))) ||
             (needle->port != conn->port)) goto LAB_0047c981;
LAB_0047c88d:
          if (bVar12) {
            if ((conn->ntlm).state == NTLMSTATE_NONE) {
              bVar3 = false;
            }
            else {
              *force_reuse = true;
              bVar3 = true;
            }
          }
          else {
            bVar3 = true;
            if ((uVar11 != 0 & _Var4) == 1) {
              if (((sVar8 <= uVar11) || (_Var5 = Curl_pipeline_penalized(data,conn), _Var5)) ||
                 (local_58 <= uVar11)) goto LAB_0047c981;
              bVar3 = false;
              local_58 = uVar11;
            }
          }
        }
        else {
LAB_0047c745:
          bVar3 = false;
          conn = local_60;
        }
      }
LAB_0047c984:
      local_60 = conn;
    } while (!bVar3);
  }
  if (local_60 != (connectdata *)0x0) {
    *usethis = local_60;
  }
  return local_60 != (connectdata *)0x0;
}

Assistant:

static bool
ConnectionExists(struct SessionHandle *data,
                 struct connectdata *needle,
                 struct connectdata **usethis,
                 bool *force_reuse)
{
  struct connectdata *check;
  struct connectdata *chosen = 0;
  bool canPipeline = IsPipeliningPossible(data, needle);
  bool wantNTLMhttp = ((data->state.authhost.want & CURLAUTH_NTLM) ||
                       (data->state.authhost.want & CURLAUTH_NTLM_WB)) &&
    (needle->handler->protocol & PROTO_FAMILY_HTTP) ? TRUE : FALSE;
  struct connectbundle *bundle;

  *force_reuse = FALSE;

  /* We can't pipe if the site is blacklisted */
  if(canPipeline && Curl_pipeline_site_blacklisted(data, needle)) {
    canPipeline = FALSE;
  }

  /* Look up the bundle with all the connections to this
     particular host */
  bundle = Curl_conncache_find_bundle(data->state.conn_cache,
                                      needle->host.name);
  if(bundle) {
    size_t max_pipe_len = Curl_multi_max_pipeline_length(data->multi);
    size_t best_pipe_len = max_pipe_len;
    struct curl_llist_element *curr;

    infof(data, "Found bundle for host %s: %p\n",
          needle->host.name, (void *)bundle);

    /* We can't pipe if we don't know anything about the server */
    if(canPipeline && !bundle->server_supports_pipelining) {
      infof(data, "Server doesn't support pipelining\n");
      canPipeline = FALSE;
    }

    curr = bundle->conn_list->head;
    while(curr) {
      bool match = FALSE;
      bool credentialsMatch = FALSE;
      size_t pipeLen;

      /*
       * Note that if we use a HTTP proxy, we check connections to that
       * proxy and not to the actual remote server.
       */
      check = curr->ptr;
      curr = curr->next;

      if(disconnect_if_dead(check, data))
        continue;

      pipeLen = check->send_pipe->size + check->recv_pipe->size;

      if(canPipeline) {
        /* Make sure the pipe has only GET requests */
        struct SessionHandle* sh = gethandleathead(check->send_pipe);
        struct SessionHandle* rh = gethandleathead(check->recv_pipe);
        if(sh) {
          if(!IsPipeliningPossible(sh, check))
            continue;
        }
        else if(rh) {
          if(!IsPipeliningPossible(rh, check))
            continue;
        }
      }
      else {
        if(pipeLen > 0) {
          /* can only happen within multi handles, and means that another easy
             handle is using this connection */
          continue;
        }

        if(Curl_resolver_asynch()) {
          /* ip_addr_str[0] is NUL only if the resolving of the name hasn't
             completed yet and until then we don't re-use this connection */
          if(!check->ip_addr_str[0]) {
            infof(data,
                  "Connection #%ld is still name resolving, can't reuse\n",
                  check->connection_id);
            continue;
          }
        }

        if((check->sock[FIRSTSOCKET] == CURL_SOCKET_BAD) ||
           check->bits.close) {
          /* Don't pick a connection that hasn't connected yet or that is going
             to get closed. */
          infof(data, "Connection #%ld isn't open enough, can't reuse\n",
                check->connection_id);
#ifdef DEBUGBUILD
          if(check->recv_pipe->size > 0) {
            infof(data,
                  "BAD! Unconnected #%ld has a non-empty recv pipeline!\n",
                  check->connection_id);
          }
#endif
          continue;
        }
      }

      if((needle->handler->flags&PROTOPT_SSL) !=
         (check->handler->flags&PROTOPT_SSL))
        /* don't do mixed SSL and non-SSL connections */
        if(!(needle->handler->protocol & check->handler->protocol))
          /* except protocols that have been upgraded via TLS */
          continue;

      if(needle->handler->flags&PROTOPT_SSL) {
        if((data->set.ssl.verifypeer != check->verifypeer) ||
           (data->set.ssl.verifyhost != check->verifyhost))
          continue;
      }

      if(needle->bits.proxy != check->bits.proxy)
        /* don't do mixed proxy and non-proxy connections */
        continue;

      if(!canPipeline && check->inuse)
        /* this request can't be pipelined but the checked connection is
           already in use so we skip it */
        continue;

      if(needle->localdev || needle->localport) {
        /* If we are bound to a specific local end (IP+port), we must not
           re-use a random other one, although if we didn't ask for a
           particular one we can reuse one that was bound.

           This comparison is a bit rough and too strict. Since the input
           parameters can be specified in numerous ways and still end up the
           same it would take a lot of processing to make it really accurate.
           Instead, this matching will assume that re-uses of bound connections
           will most likely also re-use the exact same binding parameters and
           missing out a few edge cases shouldn't hurt anyone very much.
        */
        if((check->localport != needle->localport) ||
           (check->localportrange != needle->localportrange) ||
           !check->localdev ||
           !needle->localdev ||
           strcmp(check->localdev, needle->localdev))
          continue;
      }

      if((!(needle->handler->flags & PROTOPT_CREDSPERREQUEST)) ||
         wantNTLMhttp) {
        /* This protocol requires credentials per connection or is HTTP+NTLM,
           so verify that we're using the same name and password as well */
        if(!strequal(needle->user, check->user) ||
           !strequal(needle->passwd, check->passwd)) {
          /* one of them was different */
          continue;
        }
        credentialsMatch = TRUE;
      }

      if(!needle->bits.httpproxy || needle->handler->flags&PROTOPT_SSL ||
         (needle->bits.httpproxy && check->bits.httpproxy &&
          needle->bits.tunnel_proxy && check->bits.tunnel_proxy &&
          Curl_raw_equal(needle->proxy.name, check->proxy.name) &&
          (needle->port == check->port))) {
        /* The requested connection does not use a HTTP proxy or it uses SSL or
           it is a non-SSL protocol tunneled over the same http proxy name and
           port number or it is a non-SSL protocol which is allowed to be
           upgraded via TLS */

        if((Curl_raw_equal(needle->handler->scheme, check->handler->scheme) ||
            needle->handler->protocol & check->handler->protocol) &&
           Curl_raw_equal(needle->host.name, check->host.name) &&
           needle->remote_port == check->remote_port) {
          if(needle->handler->flags & PROTOPT_SSL) {
            /* This is a SSL connection so verify that we're using the same
               SSL options as well */
            if(!Curl_ssl_config_matches(&needle->ssl_config,
                                        &check->ssl_config)) {
              DEBUGF(infof(data,
                           "Connection #%ld has different SSL parameters, "
                           "can't reuse\n",
                           check->connection_id));
              continue;
            }
            else if(check->ssl[FIRSTSOCKET].state != ssl_connection_complete) {
              DEBUGF(infof(data,
                           "Connection #%ld has not started SSL connect, "
                           "can't reuse\n",
                           check->connection_id));
              continue;
            }
          }
          match = TRUE;
        }
      }
      else { /* The requested needle connection is using a proxy,
                is the checked one using the same host, port and type? */
        if(check->bits.proxy &&
           (needle->proxytype == check->proxytype) &&
           (needle->bits.tunnel_proxy == check->bits.tunnel_proxy) &&
           Curl_raw_equal(needle->proxy.name, check->proxy.name) &&
           needle->port == check->port) {
          /* This is the same proxy connection, use it! */
          match = TRUE;
        }
      }

      if(match) {
        /* If we are looking for an HTTP+NTLM connection, check if this is
           already authenticating with the right credentials. If not, keep
           looking so that we can reuse NTLM connections if
           possible. (Especially we must not reuse the same connection if
           partway through a handshake!) */
        if(wantNTLMhttp) {
          if(credentialsMatch && check->ntlm.state != NTLMSTATE_NONE) {
            chosen = check;

            /* We must use this connection, no other */
            *force_reuse = TRUE;
            break;
          }
          else if(credentialsMatch)
            /* this is a backup choice */
            chosen = check;
          continue;
        }

        if(canPipeline) {
          /* We can pipeline if we want to. Let's continue looking for
             the optimal connection to use, i.e the shortest pipe that is not
             blacklisted. */

          if(pipeLen == 0) {
            /* We have the optimal connection. Let's stop looking. */
            chosen = check;
            break;
          }

          /* We can't use the connection if the pipe is full */
          if(pipeLen >= max_pipe_len)
            continue;

          /* We can't use the connection if the pipe is penalized */
          if(Curl_pipeline_penalized(data, check))
            continue;

          if(pipeLen < best_pipe_len) {
            /* This connection has a shorter pipe so far. We'll pick this
               and continue searching */
            chosen = check;
            best_pipe_len = pipeLen;
            continue;
          }
        }
        else {
          /* We have found a connection. Let's stop searching. */
          chosen = check;
          break;
        }
      }
    }
  }

  if(chosen) {
    *usethis = chosen;
    return TRUE; /* yes, we found one to use! */
  }

  return FALSE; /* no matching connecting exists */
}